

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O3

node_ids_t * __thiscall
libtorrent::dht::extract_node_ids
          (node_ids_t *__return_storage_ptr__,dht *this,bdecode_node *e,string_view key)

{
  bool bVar1;
  type_t tVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar8;
  char *pcVar9;
  int i;
  string_view sVar10;
  string_view key_00;
  address addr;
  node_id id;
  bdecode_node nids;
  bdecode_node nid;
  address local_108;
  digest32<160L> local_e8;
  undefined1 local_c8 [24];
  bdecode_token *pbStack_b0;
  bdecode_node local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  uint uVar7;
  
  key_00._M_str = (char *)key._M_len;
  tVar2 = bdecode_node::type((bdecode_node *)this);
  if (tVar2 == dict_t) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar10._M_str = key_00._M_str;
    sVar10._M_len = (size_t)e;
    sVar10 = bdecode_node::dict_find_string_value
                       ((bdecode_node *)this,sVar10,(string_view)ZEXT816(0));
    pcVar9 = sVar10._M_str;
    if (sVar10._M_len == 0x14) {
      local_c8._16_8_ = 0;
      pbStack_b0 = (bdecode_token *)0x0;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = 0;
      local_88.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)(pcVar9 + 0x10);
      local_88.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)pcVar9;
      local_88.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(pcVar9 + 8);
      ::std::
      vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
      ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>>
                ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                  *)__return_storage_ptr__,(address *)local_c8,(digest32<160L> *)&local_88);
    }
    else {
      key_00._M_len = (size_t)e;
      bdecode_node::dict_find_list((bdecode_node *)local_c8,(bdecode_node *)this,key_00);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_c8);
      if (bVar1) {
        i = 0;
        while( true ) {
          iVar3 = bdecode_node::list_size((bdecode_node *)local_c8);
          if (iVar3 <= i) break;
          bdecode_node::list_at(&local_88,(bdecode_node *)local_c8,i);
          tVar2 = bdecode_node::type(&local_88);
          if (tVar2 == string_t) {
            iVar3 = bdecode_node::string_length(&local_88);
            if (0x13 < iVar3) {
              puVar4 = (uint *)bdecode_node::string_ptr(&local_88);
              if (puVar4 == (uint *)0x0) {
                local_e8.m_number._M_elems[0] = 0;
                local_e8.m_number._M_elems[1] = 0;
                local_e8.m_number._M_elems[2] = 0;
                local_e8.m_number._M_elems[3] = 0;
                local_e8.m_number._M_elems[4] = 0;
              }
              else {
                local_e8.m_number._M_elems[4] = puVar4[4];
                local_e8.m_number._M_elems._0_8_ = *(undefined8 *)puVar4;
                local_e8.m_number._M_elems._8_8_ = *(undefined8 *)(puVar4 + 2);
              }
              local_108.ipv6_address_.addr_.__in6_u._8_8_ = 0;
              local_108.ipv6_address_.scope_id_ = 0;
              local_108.type_ = ipv4;
              local_108.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
              local_108.ipv6_address_.addr_.__in6_u._0_8_ = 0;
              iVar3 = bdecode_node::string_length(&local_88);
              if (iVar3 == 0x18) {
                lVar5 = 0;
                uVar6 = 0;
                do {
                  uVar8 = uVar6 << 8;
                  uVar7 = (uint)*(byte *)((long)(puVar4 + 5) + lVar5);
                  uVar6 = uVar7 | uVar8;
                  lVar5 = lVar5 + 1;
                } while ((int)lVar5 != 4);
                local_108._0_8_ =
                     (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                            uVar7 << 0x18) << 0x20;
                local_108.ipv6_address_.addr_.__in6_u._0_8_ = 0;
                local_108.ipv6_address_.addr_.__in6_u._8_8_ = 0;
              }
              else {
                iVar3 = bdecode_node::string_length(&local_88);
                if (iVar3 != 0x24) goto LAB_003a7bf9;
                local_108.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(puVar4 + 5);
                local_108.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(puVar4 + 7);
                local_108.type_ = ipv6;
                local_108.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
                local_48 = local_108.ipv6_address_.addr_.__in6_u._0_8_;
                uStack_40 = local_108.ipv6_address_.addr_.__in6_u._8_8_;
              }
              local_108.ipv6_address_.scope_id_ = 0;
              ::std::
              vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
              ::emplace_back<boost::asio::ip::address&,libtorrent::digest32<160l>&>
                        ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                          *)__return_storage_ptr__,&local_108,&local_e8);
            }
          }
LAB_003a7bf9:
          if (local_88.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_88.m_tokens.
                                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     local_88.m_tokens.
                                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                            (long)local_88.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          i = i + 1;
        }
      }
      if ((pointer)local_c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
      }
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

node_ids_t extract_node_ids(bdecode_node const& e, string_view key)
	{
		if (e.type() != bdecode_node::dict_t) return node_ids_t();
		node_ids_t ret;
		// first look for an old-style nid
		auto const old_nid = e.dict_find_string_value(key);
		if (old_nid.size() == 20)
		{
			ret.emplace_back(address(), node_id(old_nid));
			return ret;
		}
		auto const nids = e.dict_find_list(key);
		if (!nids) return ret;
		for (int i = 0; i < nids.list_size(); i++)
		{
			bdecode_node nid = nids.list_at(i);
			if (nid.type() != bdecode_node::string_t) continue;
			if (nid.string_length() < 20) continue;
			char const* in = nid.string_ptr();
			node_id id(in);
			in += id.size();
			address addr;
			if (nid.string_length() == 24)
				addr = aux::read_v4_address(in);
			else if (nid.string_length() == 36)
				addr = aux::read_v6_address(in);
			else
				continue;
			ret.emplace_back(addr, id);
		}

		return ret;
	}